

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emit_action.cc
# Opt level: O0

void re2c::genYYFill(OutputFile *o,size_t need)

{
  opt_t *poVar1;
  OutputFile *pOVar2;
  string local_58;
  string local_38;
  size_t local_18;
  size_t need_local;
  OutputFile *o_local;
  
  local_18 = need;
  need_local = (size_t)o;
  poVar1 = Opt::operator->((Opt *)&opts);
  std::__cxx11::string::string((string *)&local_58,(string *)&poVar1->fill);
  poVar1 = Opt::operator->((Opt *)&opts);
  replaceParam<unsigned_long>(&local_38,&local_58,&poVar1->fill_arg,&local_18);
  OutputFile::wstring(o,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_58);
  poVar1 = Opt::operator->((Opt *)&opts);
  if ((poVar1->fill_naked & 1U) == 0) {
    poVar1 = Opt::operator->((Opt *)&opts);
    if ((poVar1->fill_arg_use & 1U) != 0) {
      pOVar2 = OutputFile::ws((OutputFile *)need_local,"(");
      pOVar2 = OutputFile::wu64(pOVar2,local_18);
      OutputFile::ws(pOVar2,")");
    }
    OutputFile::ws((OutputFile *)need_local,";");
  }
  OutputFile::ws((OutputFile *)need_local,"\n");
  return;
}

Assistant:

void genYYFill (OutputFile & o, size_t need)
{
	o.wstring(replaceParam (opts->fill, opts->fill_arg, need));
	if (!opts->fill_naked)
	{
		if (opts->fill_arg_use)
		{
			o.ws("(").wu64(need).ws(")");
		}
		o.ws(";");
	}
	o.ws("\n");
}